

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  float fVar3;
  char cVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImDrawList *this;
  ImU32 IVar10;
  char *pcVar11;
  ImGuiCol idx;
  ulong uVar12;
  ImGuiTableColumn *pIVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  ImRect outer_border;
  ImVec2 local_68;
  ImVec2 IStack_60;
  float local_54;
  ImVec2 local_50;
  ImDrawList *local_48;
  float local_3c;
  ImDrawList *local_38;
  
  pIVar6 = table->OuterWindow;
  pIVar7 = table->InnerWindow;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar7->DrawList,0);
  if (pIVar7->Hidden != false) {
    return;
  }
  fVar16 = (table->HostClipRect).Max.y;
  pfVar1 = &(table->InnerClipRect).Min.y;
  if (fVar16 < *pfVar1 || fVar16 == *pfVar1) {
    return;
  }
  fVar16 = (table->InnerClipRect).Max.y;
  pfVar1 = &(table->HostClipRect).Min.y;
  if (fVar16 < *pfVar1 || fVar16 == *pfVar1) {
    return;
  }
  fVar16 = (table->HostClipRect).Max.x;
  if (fVar16 < (table->InnerClipRect).Min.x || fVar16 == (table->InnerClipRect).Min.x) {
    return;
  }
  fVar16 = (table->InnerClipRect).Max.x;
  if (fVar16 < (table->HostClipRect).Min.x || fVar16 == (table->HostClipRect).Min.x) {
    return;
  }
  fVar16 = (table->OuterRect).Min.y;
  local_3c = fVar16;
  if (table->IsUsingHeaders == true) {
    if (table->FreezeRowsCount < '\x01') {
      local_3c = (table->WorkRect).Min.y;
    }
    local_3c = local_3c + table->LastFirstRowHeight;
  }
  local_38 = pIVar7->DrawList;
  local_48 = pIVar6->DrawList;
  if (((table->Flags & 0x400) != 0) && (0 < table->ColumnsCount)) {
    fVar3 = (table->OuterRect).Max.y;
    uVar12 = 0;
    local_54 = fVar16;
    do {
      if ((table->VisibleMaskByDisplayOrder >> (uVar12 & 0x3f) & 1) != 0) {
        pcVar11 = (table->DisplayOrderToIndex).Data + uVar12;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar11) {
          pcVar11 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_002c371a:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                        ,0x217,pcVar11);
        }
        cVar4 = *pcVar11;
        if (((long)cVar4 < 0) ||
           (pIVar13 = (table->Columns).Data + cVar4, (table->Columns).DataEnd <= pIVar13)) {
          pcVar11 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
          goto LAB_002c371a;
        }
        if (table->ResizedColumn == cVar4) {
          bVar14 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar14 = false;
        }
        fVar15 = pIVar13->MaxX;
        pIVar2 = &(table->InnerClipRect).Max;
        if ((!(bool)((fVar15 < pIVar2->x || fVar15 == pIVar2->x) | bVar14)) ||
           (((pIVar13->NextVisibleColumn == -1 && ((pIVar13->Flags & 0x40000020U) != 0)) ||
            (fVar15 <= (pIVar13->ClipRect).Min.x)))) goto LAB_002c34dc;
        fVar15 = fVar3;
        if ((table->HoveredColumnBorder == cVar4 || bVar14) ||
           ((table->FreezeColumnsCount != -1 &&
            (uVar12 + 1 == (ulong)(uint)(int)table->FreezeColumnsCount)))) {
          if (bVar14) {
            idx = 0x1d;
          }
          else {
            if (table->HoveredColumnBorder != cVar4) {
              IVar10 = table->BorderColorStrong;
              goto LAB_002c348f;
            }
            idx = 0x1c;
          }
          IVar10 = GetColorU32(idx,1.0);
          fVar16 = local_54;
        }
        else {
          bVar14 = (table->Flags & 0x3000) == 0;
          if (!bVar14) {
            fVar15 = local_3c;
          }
          IVar10 = table->RowBgColor[(ulong)bVar14 + 2];
        }
LAB_002c348f:
        if (fVar16 < fVar15) {
          local_68.x = pIVar13->MaxX;
          local_50.y = fVar15;
          local_50.x = pIVar13->MaxX;
          local_68.y = fVar16;
          ImDrawList::AddLine(local_38,&local_68,&local_50,IVar10,1.0);
          fVar16 = local_54;
        }
      }
LAB_002c34dc:
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)table->ColumnsCount);
  }
  this = local_48;
  uVar5 = table->Flags;
  if ((uVar5 & 0xa00) != 0) {
    IVar8 = (table->OuterRect).Min;
    IVar9 = (table->OuterRect).Max;
    local_68.x = IVar8.x;
    local_68.y = IVar8.y;
    IStack_60.x = IVar9.x;
    IStack_60.y = IVar9.y;
    if (pIVar7 != pIVar6) {
      local_68.x = local_68.x + -1.0;
      local_68.y = local_68.y + -1.0;
      IStack_60.x = IStack_60.x + 1.0;
      IStack_60.y = IStack_60.y + 1.0;
    }
    IVar10 = table->BorderColorStrong;
    if ((uVar5 & 0xa00) == 0xa00) {
      ImDrawList::AddRect(local_48,&local_68,&IStack_60,IVar10,0.0,-1,1.0);
    }
    else {
      if ((uVar5 >> 0xb & 1) == 0) {
        if ((uVar5 >> 9 & 1) == 0) goto LAB_002c366d;
        local_50 = (ImVec2)(CONCAT44(IStack_60.x,local_68.y) << 0x20 | (ulong)(uint)IStack_60.x);
        ImDrawList::AddLine(local_48,&local_68,&local_50,IVar10,1.0);
        local_50.y = IStack_60.y;
        local_50.x = local_68.x;
      }
      else {
        local_50.y = IStack_60.y;
        local_50.x = local_68.x;
        ImDrawList::AddLine(local_48,&local_68,&local_50,IVar10,1.0);
        local_50 = (ImVec2)(CONCAT44(IStack_60.x,local_68.y) << 0x20 | (ulong)(uint)IStack_60.x);
      }
      ImDrawList::AddLine(this,&local_50,&IStack_60,IVar10,1.0);
    }
  }
LAB_002c366d:
  if ((((table->Flags & 0x100) != 0) &&
      (local_68.y = table->RowPosY2, local_68.y < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= local_68.y && (local_68.y < (table->BgClipRect).Max.y)))) {
    local_68.x = table->BorderX1;
    local_50.y = local_68.y;
    local_50.x = table->BorderX2;
    ImDrawList::AddLine(local_38,&local_68,&local_50,table->BorderColorLight,1.0);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_BG0);
    if (inner_window->Hidden || !table->HostClipRect.Overlaps(table->InnerClipRect))
        return;
    ImDrawList* inner_drawlist = inner_window->DrawList;
    ImDrawList* outer_drawlist = outer_window->DrawList;

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->OuterRect.Min.y;
    const float draw_y2_body = table->OuterRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ((table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;

    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;

            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)// && is_hovered)
                continue;
            if (column->NextVisibleColumn == -1 && !is_resizable)
                continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1))
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME-TABLE: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if (inner_window != outer_window) // FIXME-TABLE
            outer_border.Expand(1.0f);
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            outer_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }
}